

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

void Abc_CollectTopOr_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vSuper_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsComplement(pObj);
  if ((iVar1 == 0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
    pAVar2 = Abc_ObjChild0(pObj);
    Abc_CollectTopOr_rec(pAVar2,vSuper);
    pAVar2 = Abc_ObjChild1(pObj);
    Abc_CollectTopOr_rec(pAVar2,vSuper);
    return;
  }
  Vec_PtrPush(vSuper,pObj);
  return;
}

Assistant:

void Abc_CollectTopOr_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( Abc_ObjIsComplement(pObj) || !Abc_ObjIsNode(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return;
    }
    // go through the branches
    Abc_CollectTopOr_rec( Abc_ObjChild0(pObj), vSuper );
    Abc_CollectTopOr_rec( Abc_ObjChild1(pObj), vSuper );
}